

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

void __thiscall
google::protobuf::io::Tokenizer::ConsumeBlockComment(Tokenizer *this,string *content)

{
  ErrorCollector *pEVar1;
  uint uVar2;
  uint uVar3;
  string *psVar4;
  long lVar5;
  bool bVar6;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  uint local_20;
  uint local_1c;
  int start_column;
  int start_line;
  string *content_local;
  Tokenizer *this_local;
  
  local_1c = this->line_;
  local_20 = this->column_ - 2;
  _start_column = content;
  content_local = (string *)this;
  if (content != (string *)0x0) {
    RecordTo(this,content);
  }
  while( true ) {
    while( true ) {
      while( true ) {
        bVar6 = false;
        if (((this->current_char_ != '\0') && (bVar6 = false, this->current_char_ != '*')) &&
           (bVar6 = false, this->current_char_ != '/')) {
          bVar6 = this->current_char_ != '\n';
        }
        if (!bVar6) break;
        NextChar(this);
      }
      bVar6 = TryConsume(this,'\n');
      if (bVar6) break;
      bVar6 = TryConsume(this,'*');
      if ((bVar6) && (bVar6 = TryConsume(this,'/'), bVar6)) {
        if (_start_column == (string *)0x0) {
          return;
        }
        StopRecording(this);
        psVar4 = _start_column;
        lVar5 = std::__cxx11::string::size();
        std::__cxx11::string::erase((ulong)psVar4,lVar5 - 2);
        return;
      }
      bVar6 = TryConsume(this,'/');
      if ((bVar6) && (this->current_char_ == '*')) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,
                   "\"/*\" inside block comment.  Block comments cannot be nested.",&local_41);
        AddError(this,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        std::allocator<char>::~allocator(&local_41);
      }
      else if (this->current_char_ == '\0') {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"End-of-file inside block comment.",&local_79);
        AddError(this,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator(&local_79);
        uVar3 = local_1c;
        uVar2 = local_20;
        pEVar1 = this->error_collector_;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (&local_90,"  Comment started here.");
        (*pEVar1->_vptr_ErrorCollector[2])
                  (pEVar1,(ulong)uVar3,(ulong)uVar2,local_90._M_len,local_90._M_str);
        if (_start_column != (string *)0x0) {
          StopRecording(this);
        }
        return;
      }
    }
    if (_start_column != (string *)0x0) {
      StopRecording(this);
    }
    ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::WhitespaceNoNewline>(this);
    bVar6 = TryConsume(this,'*');
    if ((bVar6) && (bVar6 = TryConsume(this,'/'), bVar6)) break;
    if (_start_column != (string *)0x0) {
      RecordTo(this,_start_column);
    }
  }
  return;
}

Assistant:

void Tokenizer::ConsumeBlockComment(std::string* content) {
  int start_line = line_;
  int start_column = column_ - 2;

  if (content != nullptr) RecordTo(content);

  while (true) {
    while (current_char_ != '\0' && current_char_ != '*' &&
           current_char_ != '/' && current_char_ != '\n') {
      NextChar();
    }

    if (TryConsume('\n')) {
      if (content != nullptr) StopRecording();

      // Consume leading whitespace and asterisk;
      ConsumeZeroOrMore<WhitespaceNoNewline>();
      if (TryConsume('*')) {
        if (TryConsume('/')) {
          // End of comment.
          break;
        }
      }

      if (content != nullptr) RecordTo(content);
    } else if (TryConsume('*') && TryConsume('/')) {
      // End of comment.
      if (content != nullptr) {
        StopRecording();
        // Strip trailing "*/".
        content->erase(content->size() - 2);
      }
      break;
    } else if (TryConsume('/') && current_char_ == '*') {
      // Note:  We didn't consume the '*' because if there is a '/' after it
      //   we want to interpret that as the end of the comment.
      AddError(
          "\"/*\" inside block comment.  Block comments cannot be nested.");
    } else if (current_char_ == '\0') {
      AddError("End-of-file inside block comment.");
      error_collector_->RecordError(start_line, start_column,
                                    "  Comment started here.");
      if (content != nullptr) StopRecording();
      break;
    }
  }
}